

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O2

void fmt::v9::detail::convert_arg<long,fmt::v9::basic_printf_context<fmt::v9::appender,char>,char>
               (basic_format_arg<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> *arg,
               char type)

{
  uint uVar1;
  longlong lVar2;
  size_t sVar3;
  ulong uVar4;
  type tVar5;
  arg_converter<long,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> local_10;
  
  local_10.arg_ = arg;
  local_10.type_ = type;
  switch(arg->type_) {
  case int_type:
    uVar1 = (arg->value_).field_0.int_value;
    uVar4 = (ulong)(int)uVar1;
    if ((type == 'i') || (type == 'd')) {
      tVar5 = long_long_type;
    }
    else {
      uVar4 = (ulong)uVar1;
      tVar5 = uint_type;
    }
    goto LAB_002a32f0;
  case uint_type:
    uVar4 = (ulong)(arg->value_).field_0.uint_value;
    tVar5 = (type == 'd' || type == 'i') | uint_type;
LAB_002a32f0:
    *(ulong *)&(arg->value_).field_0 = uVar4;
LAB_002a32f3:
    arg->type_ = tVar5;
    break;
  case long_long_type:
  case ulong_long_type:
    tVar5 = ulong_long_type - (type == 'd' || type == 'i');
    goto LAB_002a32f3;
  case int128_type:
  case uint128_type:
    lVar2 = (arg->value_).field_0.long_long_value;
    if ((type == 'i') || (type == 'd')) {
      (arg->value_).field_0.long_long_value = lVar2;
      tVar5 = long_long_type;
    }
    else {
      sVar3 = (arg->value_).field_0.string.size;
      (arg->value_).field_0.long_long_value = lVar2;
      (arg->value_).field_0.string.size = sVar3;
      tVar5 = uint128_type;
    }
    arg->type_ = tVar5;
    break;
  case bool_type:
    arg_converter<long,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::operator()
              (&local_10,(arg->value_).field_0.bool_value);
    break;
  case char_type:
    arg_converter<long,_fmt::v9::basic_printf_context<fmt::v9::appender,_char>_>::
    operator()<char,_0>(&local_10,(arg->value_).field_0.char_value);
  }
  return;
}

Assistant:

void convert_arg(basic_format_arg<Context>& arg, Char type) {
  visit_format_arg(arg_converter<T, Context>(arg, type), arg);
}